

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo2.cpp
# Opt level: O1

int64_t primecount::pi_lmo2(int64_t x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  size_t sVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  bool *pbVar55;
  bool bVar56;
  ulong uVar57;
  int64_t iVar58;
  size_t n;
  ulong uVar59;
  long lVar60;
  long lVar61;
  size_t sVar62;
  ulong uVar63;
  long res;
  ulong uVar64;
  long lVar65;
  ulong uVar66;
  long lVar67;
  int64_t k;
  int64_t k_1;
  long lVar68;
  long lVar69;
  ulong a;
  bool *pbVar70;
  ulong max;
  ulong uVar71;
  double dVar72;
  double dVar73;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  int iVar113;
  int iVar118;
  int iVar119;
  undefined1 auVar114 [16];
  int iVar120;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  int iVar146;
  int iVar153;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  type primes;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  Vector<bool,_std::allocator<bool>_> sieve;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  Vector<int,_std::allocator<int>_> local_d0;
  long local_b8;
  ulong local_b0;
  int64_t local_a8;
  int *local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  Vector<int,_std::allocator<int>_> local_78;
  Vector<int,_std::allocator<int>_> local_60;
  Vector<bool,_std::allocator<bool>_> local_48;
  
  if (x < 2) {
    iVar58 = 0;
  }
  else {
    auVar74._8_8_ = in_stack_fffffffffffffef0;
    auVar74._0_8_ = in_stack_fffffffffffffee8;
    dVar72 = get_alpha_lmo((primecount *)x,(maxint_t)auVar74);
    dVar73 = cbrt((double)x);
    uVar64 = (ulong)dVar73;
    if (0 < (long)uVar64) {
      do {
        if (uVar64 * uVar64 - (ulong)x / uVar64 == 0 ||
            (long)(uVar64 * uVar64) < (long)((ulong)x / uVar64)) goto LAB_0011a089;
        bVar56 = 1 < (long)uVar64;
        uVar64 = uVar64 - 1;
      } while (bVar56);
      uVar64 = 0;
    }
LAB_0011a089:
    lVar65 = uVar64 - 1;
    do {
      lVar68 = lVar65 + 2;
      lVar65 = lVar65 + 1;
    } while (lVar68 * lVar68 - x / lVar68 == 0 || lVar68 * lVar68 < x / lVar68);
    auVar75._0_8_ = dVar72 * (double)lVar65;
    auVar75._8_8_ = 0;
    max = (ulong)auVar75._0_8_;
    uVar64 = 8;
    if (max < 0x14) {
      uVar64 = (ulong)(byte)(&PhiTiny::pi)[max];
    }
    generate_primes_i32(&local_d0,max);
    generate_lpf(&local_60,max);
    generate_moebius(&local_78,max);
    lVar65 = (long)local_d0.end_ - (long)local_d0.array_;
    bVar56 = is_print();
    a = (lVar65 >> 2) - 1;
    uVar57 = P2(x,max,a,1,bVar56);
    bVar56 = is_print();
    iVar58 = S1(x,max,uVar64,1,bVar56);
    n = x / (long)max;
    local_48.array_ = (bool *)0x0;
    local_48.end_ = (bool *)0x0;
    local_48.capacity_ = (bool *)0x0;
    local_b0 = uVar57;
    Vector<bool,_std::allocator<bool>_>::resize(&local_48,n);
    pbVar55 = local_48.array_;
    auVar74 = extraout_XMM0;
    if (local_48.array_ != local_48.end_) {
      memset(local_48.array_,1,(long)local_48.end_ - (long)local_48.array_);
      auVar74 = extraout_XMM0_00;
    }
    auVar54 = _DAT_00152b50;
    auVar53 = _DAT_00152b40;
    auVar52 = _DAT_00152b30;
    auVar51 = _DAT_00152b20;
    auVar50 = _DAT_00152b10;
    auVar49 = _DAT_00152b00;
    auVar48 = _DAT_00152af0;
    if (uVar64 == 0) {
      uVar57 = 1;
    }
    else {
      uVar63 = 1;
      do {
        uVar57 = (ulong)local_d0.array_[uVar63];
        if ((long)uVar57 < (long)n) {
          sVar47 = uVar57 * 2;
          uVar66 = (ulong)((long)sVar47 < (long)n);
          sVar62 = sVar47;
          if ((long)sVar47 < (long)n) {
            sVar62 = n;
          }
          uVar59 = ((sVar62 - uVar66) + uVar57 * -2) / uVar57;
          lVar65 = uVar66 + uVar59;
          auVar116._8_4_ = (int)lVar65;
          auVar116._0_8_ = lVar65;
          auVar116._12_4_ = (int)((ulong)lVar65 >> 0x20);
          uVar71 = 0;
          pbVar70 = pbVar55;
          do {
            auVar109._8_4_ = (int)uVar71;
            auVar109._0_8_ = uVar71;
            auVar109._12_4_ = (int)(uVar71 >> 0x20);
            auVar114 = auVar116 ^ auVar54;
            auVar121 = (auVar109 | auVar53) ^ auVar54;
            iVar113 = auVar114._0_4_;
            iVar146 = -(uint)(iVar113 < auVar121._0_4_);
            iVar118 = auVar114._4_4_;
            auVar123._4_4_ = -(uint)(iVar118 < auVar121._4_4_);
            iVar119 = auVar114._8_4_;
            iVar153 = -(uint)(iVar119 < auVar121._8_4_);
            iVar120 = auVar114._12_4_;
            auVar123._12_4_ = -(uint)(iVar120 < auVar121._12_4_);
            auVar93._4_4_ = iVar146;
            auVar93._0_4_ = iVar146;
            auVar93._8_4_ = iVar153;
            auVar93._12_4_ = iVar153;
            auVar74 = pshuflw(auVar74,auVar93,0xe8);
            auVar122._4_4_ = -(uint)(auVar121._4_4_ == iVar118);
            auVar122._12_4_ = -(uint)(auVar121._12_4_ == iVar120);
            auVar122._0_4_ = auVar122._4_4_;
            auVar122._8_4_ = auVar122._12_4_;
            auVar93 = pshuflw(auVar75,auVar122,0xe8);
            auVar123._0_4_ = auVar123._4_4_;
            auVar123._8_4_ = auVar123._12_4_;
            auVar75 = pshuflw(auVar74,auVar123,0xe8);
            auVar114._8_4_ = 0xffffffff;
            auVar114._0_8_ = 0xffffffffffffffff;
            auVar114._12_4_ = 0xffffffff;
            auVar114 = (auVar75 | auVar93 & auVar74) ^ auVar114;
            auVar74 = packssdw(auVar114,auVar114);
            if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pbVar70[uVar57] = false;
            }
            auVar20._4_4_ = iVar146;
            auVar20._0_4_ = iVar146;
            auVar20._8_4_ = iVar153;
            auVar20._12_4_ = iVar153;
            auVar123 = auVar122 & auVar20 | auVar123;
            auVar74 = packssdw(auVar123,auVar123);
            auVar121._8_4_ = 0xffffffff;
            auVar121._0_8_ = 0xffffffffffffffff;
            auVar121._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar121,auVar74 ^ auVar121);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._0_4_ >> 8 & 1) != 0) {
              pbVar70[sVar47] = false;
            }
            auVar74 = (auVar109 | auVar52) ^ auVar54;
            auVar94._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar94._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar94._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar94._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar124._4_4_ = auVar94._0_4_;
            auVar124._0_4_ = auVar94._0_4_;
            auVar124._8_4_ = auVar94._8_4_;
            auVar124._12_4_ = auVar94._8_4_;
            iVar146 = -(uint)(auVar74._4_4_ == iVar118);
            iVar153 = -(uint)(auVar74._12_4_ == iVar120);
            auVar21._4_4_ = iVar146;
            auVar21._0_4_ = iVar146;
            auVar21._8_4_ = iVar153;
            auVar21._12_4_ = iVar153;
            auVar147._4_4_ = auVar94._4_4_;
            auVar147._0_4_ = auVar94._4_4_;
            auVar147._8_4_ = auVar94._12_4_;
            auVar147._12_4_ = auVar94._12_4_;
            auVar74 = auVar21 & auVar124 | auVar147;
            auVar74 = packssdw(auVar74,auVar74);
            auVar1._8_4_ = 0xffffffff;
            auVar1._0_8_ = 0xffffffffffffffff;
            auVar1._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar1,auVar74 ^ auVar1);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._0_4_ >> 0x10 & 1) != 0) {
              pbVar70[uVar57 * 3] = false;
            }
            auVar74 = pshufhw(auVar74,auVar124,0x84);
            auVar22._4_4_ = iVar146;
            auVar22._0_4_ = iVar146;
            auVar22._8_4_ = iVar153;
            auVar22._12_4_ = iVar153;
            auVar114 = pshufhw(auVar94,auVar22,0x84);
            auVar75 = pshufhw(auVar74,auVar147,0x84);
            auVar76._8_4_ = 0xffffffff;
            auVar76._0_8_ = 0xffffffffffffffff;
            auVar76._12_4_ = 0xffffffff;
            auVar76 = (auVar75 | auVar114 & auVar74) ^ auVar76;
            auVar74 = packssdw(auVar76,auVar76);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._0_4_ >> 0x18 & 1) != 0) {
              pbVar70[uVar57 * 4] = false;
            }
            auVar74 = (auVar109 | auVar51) ^ auVar54;
            auVar95._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar95._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar95._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar95._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar23._4_4_ = auVar95._0_4_;
            auVar23._0_4_ = auVar95._0_4_;
            auVar23._8_4_ = auVar95._8_4_;
            auVar23._12_4_ = auVar95._8_4_;
            auVar114 = pshuflw(auVar147,auVar23,0xe8);
            auVar77._0_4_ = -(uint)(auVar74._0_4_ == iVar113);
            auVar77._4_4_ = -(uint)(auVar74._4_4_ == iVar118);
            auVar77._8_4_ = -(uint)(auVar74._8_4_ == iVar119);
            auVar77._12_4_ = -(uint)(auVar74._12_4_ == iVar120);
            auVar125._4_4_ = auVar77._4_4_;
            auVar125._0_4_ = auVar77._4_4_;
            auVar125._8_4_ = auVar77._12_4_;
            auVar125._12_4_ = auVar77._12_4_;
            auVar74 = pshuflw(auVar77,auVar125,0xe8);
            auVar126._4_4_ = auVar95._4_4_;
            auVar126._0_4_ = auVar95._4_4_;
            auVar126._8_4_ = auVar95._12_4_;
            auVar126._12_4_ = auVar95._12_4_;
            auVar75 = pshuflw(auVar95,auVar126,0xe8);
            auVar2._8_4_ = 0xffffffff;
            auVar2._0_8_ = 0xffffffffffffffff;
            auVar2._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 & auVar114,(auVar75 | auVar74 & auVar114) ^ auVar2);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pbVar70[uVar57 * 5] = false;
            }
            auVar24._4_4_ = auVar95._0_4_;
            auVar24._0_4_ = auVar95._0_4_;
            auVar24._8_4_ = auVar95._8_4_;
            auVar24._12_4_ = auVar95._8_4_;
            auVar126 = auVar125 & auVar24 | auVar126;
            auVar75 = packssdw(auVar126,auVar126);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74,auVar75 ^ auVar3);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._4_2_ >> 8 & 1) != 0) {
              pbVar70[uVar57 * 6] = false;
            }
            auVar74 = (auVar109 | auVar50) ^ auVar54;
            auVar96._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar96._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar96._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar96._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar127._4_4_ = auVar96._0_4_;
            auVar127._0_4_ = auVar96._0_4_;
            auVar127._8_4_ = auVar96._8_4_;
            auVar127._12_4_ = auVar96._8_4_;
            iVar146 = -(uint)(auVar74._4_4_ == iVar118);
            iVar153 = -(uint)(auVar74._12_4_ == iVar120);
            auVar25._4_4_ = iVar146;
            auVar25._0_4_ = iVar146;
            auVar25._8_4_ = iVar153;
            auVar25._12_4_ = iVar153;
            auVar148._4_4_ = auVar96._4_4_;
            auVar148._0_4_ = auVar96._4_4_;
            auVar148._8_4_ = auVar96._12_4_;
            auVar148._12_4_ = auVar96._12_4_;
            auVar74 = auVar25 & auVar127 | auVar148;
            auVar74 = packssdw(auVar74,auVar74);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar4,auVar74 ^ auVar4);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pbVar70[uVar57 * 7] = false;
            }
            auVar74 = pshufhw(auVar74,auVar127,0x84);
            auVar26._4_4_ = iVar146;
            auVar26._0_4_ = iVar146;
            auVar26._8_4_ = iVar153;
            auVar26._12_4_ = iVar153;
            auVar114 = pshufhw(auVar96,auVar26,0x84);
            auVar75 = pshufhw(auVar74,auVar148,0x84);
            auVar78._8_4_ = 0xffffffff;
            auVar78._0_8_ = 0xffffffffffffffff;
            auVar78._12_4_ = 0xffffffff;
            auVar78 = (auVar75 | auVar114 & auVar74) ^ auVar78;
            auVar74 = packssdw(auVar78,auVar78);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._6_2_ >> 8 & 1) != 0) {
              pbVar70[uVar57 * 8] = false;
            }
            auVar74 = (auVar109 | auVar49) ^ auVar54;
            auVar97._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar97._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar97._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar97._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar27._4_4_ = auVar97._0_4_;
            auVar27._0_4_ = auVar97._0_4_;
            auVar27._8_4_ = auVar97._8_4_;
            auVar27._12_4_ = auVar97._8_4_;
            auVar114 = pshuflw(auVar148,auVar27,0xe8);
            auVar79._0_4_ = -(uint)(auVar74._0_4_ == iVar113);
            auVar79._4_4_ = -(uint)(auVar74._4_4_ == iVar118);
            auVar79._8_4_ = -(uint)(auVar74._8_4_ == iVar119);
            auVar79._12_4_ = -(uint)(auVar74._12_4_ == iVar120);
            auVar128._4_4_ = auVar79._4_4_;
            auVar128._0_4_ = auVar79._4_4_;
            auVar128._8_4_ = auVar79._12_4_;
            auVar128._12_4_ = auVar79._12_4_;
            auVar74 = pshuflw(auVar79,auVar128,0xe8);
            auVar129._4_4_ = auVar97._4_4_;
            auVar129._0_4_ = auVar97._4_4_;
            auVar129._8_4_ = auVar97._12_4_;
            auVar129._12_4_ = auVar97._12_4_;
            auVar75 = pshuflw(auVar97,auVar129,0xe8);
            auVar98._8_4_ = 0xffffffff;
            auVar98._0_8_ = 0xffffffffffffffff;
            auVar98._12_4_ = 0xffffffff;
            auVar98 = (auVar75 | auVar74 & auVar114) ^ auVar98;
            auVar75 = packssdw(auVar98,auVar98);
            auVar74 = packsswb(auVar74 & auVar114,auVar75);
            if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pbVar70[uVar57 * 9] = false;
            }
            auVar28._4_4_ = auVar97._0_4_;
            auVar28._0_4_ = auVar97._0_4_;
            auVar28._8_4_ = auVar97._8_4_;
            auVar28._12_4_ = auVar97._8_4_;
            auVar129 = auVar128 & auVar28 | auVar129;
            auVar75 = packssdw(auVar129,auVar129);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar75 = packssdw(auVar75 ^ auVar5,auVar75 ^ auVar5);
            auVar74 = packsswb(auVar74,auVar75);
            if ((auVar74._8_2_ >> 8 & 1) != 0) {
              pbVar70[uVar57 * 10] = false;
            }
            auVar74 = (auVar109 | auVar48) ^ auVar54;
            auVar99._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar99._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar99._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar99._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar130._4_4_ = auVar99._0_4_;
            auVar130._0_4_ = auVar99._0_4_;
            auVar130._8_4_ = auVar99._8_4_;
            auVar130._12_4_ = auVar99._8_4_;
            iVar146 = -(uint)(auVar74._4_4_ == iVar118);
            iVar153 = -(uint)(auVar74._12_4_ == iVar120);
            auVar29._4_4_ = iVar146;
            auVar29._0_4_ = iVar146;
            auVar29._8_4_ = iVar153;
            auVar29._12_4_ = iVar153;
            auVar149._4_4_ = auVar99._4_4_;
            auVar149._0_4_ = auVar99._4_4_;
            auVar149._8_4_ = auVar99._12_4_;
            auVar149._12_4_ = auVar99._12_4_;
            auVar74 = auVar29 & auVar130 | auVar149;
            auVar74 = packssdw(auVar74,auVar74);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar6,auVar74 ^ auVar6);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              pbVar70[uVar57 * 0xb] = false;
            }
            auVar74 = pshufhw(auVar74,auVar130,0x84);
            auVar30._4_4_ = iVar146;
            auVar30._0_4_ = iVar146;
            auVar30._8_4_ = iVar153;
            auVar30._12_4_ = iVar153;
            auVar114 = pshufhw(auVar99,auVar30,0x84);
            auVar75 = pshufhw(auVar74,auVar149,0x84);
            auVar80._8_4_ = 0xffffffff;
            auVar80._0_8_ = 0xffffffffffffffff;
            auVar80._12_4_ = 0xffffffff;
            auVar80 = (auVar75 | auVar114 & auVar74) ^ auVar80;
            auVar74 = packssdw(auVar80,auVar80);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._10_2_ >> 8 & 1) != 0) {
              pbVar70[uVar57 * 0xc] = false;
            }
            auVar74 = (auVar109 | _DAT_00152ae0) ^ auVar54;
            auVar100._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar100._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar100._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar100._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar31._4_4_ = auVar100._0_4_;
            auVar31._0_4_ = auVar100._0_4_;
            auVar31._8_4_ = auVar100._8_4_;
            auVar31._12_4_ = auVar100._8_4_;
            auVar114 = pshuflw(auVar149,auVar31,0xe8);
            auVar81._0_4_ = -(uint)(auVar74._0_4_ == iVar113);
            auVar81._4_4_ = -(uint)(auVar74._4_4_ == iVar118);
            auVar81._8_4_ = -(uint)(auVar74._8_4_ == iVar119);
            auVar81._12_4_ = -(uint)(auVar74._12_4_ == iVar120);
            auVar131._4_4_ = auVar81._4_4_;
            auVar131._0_4_ = auVar81._4_4_;
            auVar131._8_4_ = auVar81._12_4_;
            auVar131._12_4_ = auVar81._12_4_;
            auVar74 = pshuflw(auVar81,auVar131,0xe8);
            auVar132._4_4_ = auVar100._4_4_;
            auVar132._0_4_ = auVar100._4_4_;
            auVar132._8_4_ = auVar100._12_4_;
            auVar132._12_4_ = auVar100._12_4_;
            auVar75 = pshuflw(auVar100,auVar132,0xe8);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 & auVar114,(auVar75 | auVar74 & auVar114) ^ auVar7);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pbVar70[uVar57 * 0xd] = false;
            }
            auVar32._4_4_ = auVar100._0_4_;
            auVar32._0_4_ = auVar100._0_4_;
            auVar32._8_4_ = auVar100._8_4_;
            auVar32._12_4_ = auVar100._8_4_;
            auVar132 = auVar131 & auVar32 | auVar132;
            auVar75 = packssdw(auVar132,auVar132);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74,auVar75 ^ auVar8);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._12_2_ >> 8 & 1) != 0) {
              pbVar70[uVar57 * 0xe] = false;
            }
            auVar74 = (auVar109 | _DAT_00152ad0) ^ auVar54;
            auVar82._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar82._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar82._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar82._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar133._4_4_ = auVar82._0_4_;
            auVar133._0_4_ = auVar82._0_4_;
            auVar133._8_4_ = auVar82._8_4_;
            auVar133._12_4_ = auVar82._8_4_;
            auVar110._4_4_ = -(uint)(auVar74._4_4_ == iVar118);
            auVar110._12_4_ = -(uint)(auVar74._12_4_ == iVar120);
            auVar110._0_4_ = auVar110._4_4_;
            auVar110._8_4_ = auVar110._12_4_;
            auVar115._4_4_ = auVar82._4_4_;
            auVar115._0_4_ = auVar82._4_4_;
            auVar115._8_4_ = auVar82._12_4_;
            auVar115._12_4_ = auVar82._12_4_;
            auVar75 = auVar110 & auVar133 | auVar115;
            auVar74 = packssdw(auVar82,auVar75);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar9,auVar74 ^ auVar9);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pbVar70[uVar57 * 0xf] = false;
            }
            auVar74 = pshufhw(auVar74,auVar133,0x84);
            auVar75 = pshufhw(auVar75,auVar110,0x84);
            auVar75 = auVar75 & auVar74;
            auVar74 = pshufhw(auVar74,auVar115,0x84);
            auVar83._8_4_ = 0xffffffff;
            auVar83._0_8_ = 0xffffffffffffffff;
            auVar83._12_4_ = 0xffffffff;
            auVar83 = (auVar74 | auVar75) ^ auVar83;
            auVar74 = packssdw(auVar83,auVar83);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._14_2_ >> 8 & 1) != 0) {
              pbVar70[uVar57 * 0x10] = false;
            }
            uVar71 = uVar71 + 0x10;
            pbVar70 = pbVar70 + uVar57 * 0x10;
          } while ((uVar59 + uVar66 + 0x10 & 0xfffffffffffffff0) != uVar71);
        }
        uVar57 = uVar63 + 1;
        bVar56 = uVar63 != uVar64;
        uVar63 = uVar57;
      } while (bVar56);
    }
    auVar54 = _DAT_00152b50;
    auVar53 = _DAT_00152b40;
    auVar52 = _DAT_00152b30;
    auVar51 = _DAT_00152b20;
    auVar50 = _DAT_00152b10;
    auVar49 = _DAT_00152b00;
    auVar48 = _DAT_00152af0;
    if ((long)uVar57 < (long)a) {
      local_a0 = local_d0.array_;
      lVar65 = 0;
      do {
        lVar68 = (long)local_d0.array_[uVar57];
        if ((long)max / lVar68 < (long)max) {
          lVar67 = 0;
          lVar69 = 1;
          uVar64 = max;
          do {
            lVar61 = lVar69;
            if (((long)local_78.array_[uVar64] != 0) &&
               (local_d0.array_[uVar57] < local_60.array_[uVar64])) {
              lVar60 = x / (long)(uVar64 * lVar68);
              if (lVar69 <= lVar60) {
                lVar61 = lVar60 + 1;
                do {
                  lVar67 = lVar67 + (ulong)pbVar55[lVar69];
                  lVar69 = lVar69 + 1;
                } while (lVar61 != lVar69);
              }
              lVar65 = lVar65 - local_78.array_[uVar64] * lVar67;
            }
            uVar64 = uVar64 - 1;
            lVar69 = lVar61;
          } while ((long)max / lVar68 < (long)uVar64);
        }
        if (lVar68 < (long)n) {
          sVar47 = lVar68 * 3;
          uVar64 = (ulong)((long)sVar47 < (long)n);
          sVar62 = sVar47;
          if ((long)sVar47 < (long)n) {
            sVar62 = n;
          }
          uVar63 = ((sVar62 - uVar64) + lVar68 * -3) / (ulong)(lVar68 * 2);
          lVar69 = uVar64 + uVar63;
          auVar108._8_4_ = (int)lVar69;
          auVar108._0_8_ = lVar69;
          auVar108._12_4_ = (int)((ulong)lVar69 >> 0x20);
          local_80 = lVar68 * 0xd;
          local_88 = lVar68 * 0xb;
          uVar66 = 0;
          pbVar70 = pbVar55;
          do {
            auVar111._8_4_ = (int)uVar66;
            auVar111._0_8_ = uVar66;
            auVar111._12_4_ = (int)(uVar66 >> 0x20);
            auVar116 = auVar108 ^ auVar54;
            auVar114 = (auVar111 | auVar53) ^ auVar54;
            iVar113 = auVar116._0_4_;
            iVar146 = -(uint)(iVar113 < auVar114._0_4_);
            iVar118 = auVar116._4_4_;
            auVar135._4_4_ = -(uint)(iVar118 < auVar114._4_4_);
            iVar119 = auVar116._8_4_;
            iVar153 = -(uint)(iVar119 < auVar114._8_4_);
            iVar120 = auVar116._12_4_;
            auVar135._12_4_ = -(uint)(iVar120 < auVar114._12_4_);
            auVar33._4_4_ = iVar146;
            auVar33._0_4_ = iVar146;
            auVar33._8_4_ = iVar153;
            auVar33._12_4_ = iVar153;
            auVar74 = pshuflw(auVar74,auVar33,0xe8);
            auVar134._4_4_ = -(uint)(auVar114._4_4_ == iVar118);
            auVar134._12_4_ = -(uint)(auVar114._12_4_ == iVar120);
            auVar134._0_4_ = auVar134._4_4_;
            auVar134._8_4_ = auVar134._12_4_;
            auVar116 = pshuflw(auVar75,auVar134,0xe8);
            auVar135._0_4_ = auVar135._4_4_;
            auVar135._8_4_ = auVar135._12_4_;
            auVar75 = pshuflw(auVar74,auVar135,0xe8);
            auVar84._8_4_ = 0xffffffff;
            auVar84._0_8_ = 0xffffffffffffffff;
            auVar84._12_4_ = 0xffffffff;
            auVar84 = (auVar75 | auVar116 & auVar74) ^ auVar84;
            auVar74 = packssdw(auVar84,auVar84);
            if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pbVar70[lVar68] = false;
            }
            auVar34._4_4_ = iVar146;
            auVar34._0_4_ = iVar146;
            auVar34._8_4_ = iVar153;
            auVar34._12_4_ = iVar153;
            auVar135 = auVar134 & auVar34 | auVar135;
            auVar74 = packssdw(auVar135,auVar135);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar10,auVar74 ^ auVar10);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._0_4_ >> 8 & 1) != 0) {
              pbVar70[sVar47] = false;
            }
            auVar74 = (auVar111 | auVar52) ^ auVar54;
            auVar101._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar101._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar101._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar101._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar136._4_4_ = auVar101._0_4_;
            auVar136._0_4_ = auVar101._0_4_;
            auVar136._8_4_ = auVar101._8_4_;
            auVar136._12_4_ = auVar101._8_4_;
            iVar146 = -(uint)(auVar74._4_4_ == iVar118);
            iVar153 = -(uint)(auVar74._12_4_ == iVar120);
            auVar35._4_4_ = iVar146;
            auVar35._0_4_ = iVar146;
            auVar35._8_4_ = iVar153;
            auVar35._12_4_ = iVar153;
            auVar150._4_4_ = auVar101._4_4_;
            auVar150._0_4_ = auVar101._4_4_;
            auVar150._8_4_ = auVar101._12_4_;
            auVar150._12_4_ = auVar101._12_4_;
            auVar74 = auVar35 & auVar136 | auVar150;
            auVar74 = packssdw(auVar74,auVar74);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar11,auVar74 ^ auVar11);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._0_4_ >> 0x10 & 1) != 0) {
              pbVar70[lVar68 * 5] = false;
            }
            auVar74 = pshufhw(auVar74,auVar136,0x84);
            auVar36._4_4_ = iVar146;
            auVar36._0_4_ = iVar146;
            auVar36._8_4_ = iVar153;
            auVar36._12_4_ = iVar153;
            auVar116 = pshufhw(auVar101,auVar36,0x84);
            auVar75 = pshufhw(auVar74,auVar150,0x84);
            auVar85._8_4_ = 0xffffffff;
            auVar85._0_8_ = 0xffffffffffffffff;
            auVar85._12_4_ = 0xffffffff;
            auVar85 = (auVar75 | auVar116 & auVar74) ^ auVar85;
            auVar74 = packssdw(auVar85,auVar85);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._0_4_ >> 0x18 & 1) != 0) {
              pbVar70[lVar68 * 7] = false;
            }
            auVar74 = (auVar111 | auVar51) ^ auVar54;
            auVar102._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar102._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar102._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar102._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar37._4_4_ = auVar102._0_4_;
            auVar37._0_4_ = auVar102._0_4_;
            auVar37._8_4_ = auVar102._8_4_;
            auVar37._12_4_ = auVar102._8_4_;
            auVar116 = pshuflw(auVar150,auVar37,0xe8);
            auVar86._0_4_ = -(uint)(auVar74._0_4_ == iVar113);
            auVar86._4_4_ = -(uint)(auVar74._4_4_ == iVar118);
            auVar86._8_4_ = -(uint)(auVar74._8_4_ == iVar119);
            auVar86._12_4_ = -(uint)(auVar74._12_4_ == iVar120);
            auVar137._4_4_ = auVar86._4_4_;
            auVar137._0_4_ = auVar86._4_4_;
            auVar137._8_4_ = auVar86._12_4_;
            auVar137._12_4_ = auVar86._12_4_;
            auVar74 = pshuflw(auVar86,auVar137,0xe8);
            auVar138._4_4_ = auVar102._4_4_;
            auVar138._0_4_ = auVar102._4_4_;
            auVar138._8_4_ = auVar102._12_4_;
            auVar138._12_4_ = auVar102._12_4_;
            auVar75 = pshuflw(auVar102,auVar138,0xe8);
            auVar12._8_4_ = 0xffffffff;
            auVar12._0_8_ = 0xffffffffffffffff;
            auVar12._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 & auVar116,(auVar75 | auVar74 & auVar116) ^ auVar12);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pbVar70[lVar68 * 9] = false;
            }
            auVar38._4_4_ = auVar102._0_4_;
            auVar38._0_4_ = auVar102._0_4_;
            auVar38._8_4_ = auVar102._8_4_;
            auVar38._12_4_ = auVar102._8_4_;
            auVar138 = auVar137 & auVar38 | auVar138;
            auVar75 = packssdw(auVar138,auVar138);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74,auVar75 ^ auVar13);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._4_2_ >> 8 & 1) != 0) {
              pbVar70[local_88] = false;
            }
            auVar74 = (auVar111 | auVar50) ^ auVar54;
            auVar103._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar103._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar103._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar103._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar139._4_4_ = auVar103._0_4_;
            auVar139._0_4_ = auVar103._0_4_;
            auVar139._8_4_ = auVar103._8_4_;
            auVar139._12_4_ = auVar103._8_4_;
            iVar146 = -(uint)(auVar74._4_4_ == iVar118);
            iVar153 = -(uint)(auVar74._12_4_ == iVar120);
            auVar39._4_4_ = iVar146;
            auVar39._0_4_ = iVar146;
            auVar39._8_4_ = iVar153;
            auVar39._12_4_ = iVar153;
            auVar151._4_4_ = auVar103._4_4_;
            auVar151._0_4_ = auVar103._4_4_;
            auVar151._8_4_ = auVar103._12_4_;
            auVar151._12_4_ = auVar103._12_4_;
            auVar74 = auVar39 & auVar139 | auVar151;
            auVar74 = packssdw(auVar74,auVar74);
            auVar14._8_4_ = 0xffffffff;
            auVar14._0_8_ = 0xffffffffffffffff;
            auVar14._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar14,auVar74 ^ auVar14);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pbVar70[local_80] = false;
            }
            auVar74 = pshufhw(auVar74,auVar139,0x84);
            auVar40._4_4_ = iVar146;
            auVar40._0_4_ = iVar146;
            auVar40._8_4_ = iVar153;
            auVar40._12_4_ = iVar153;
            auVar116 = pshufhw(auVar103,auVar40,0x84);
            auVar75 = pshufhw(auVar74,auVar151,0x84);
            auVar87._8_4_ = 0xffffffff;
            auVar87._0_8_ = 0xffffffffffffffff;
            auVar87._12_4_ = 0xffffffff;
            auVar87 = (auVar75 | auVar116 & auVar74) ^ auVar87;
            auVar74 = packssdw(auVar87,auVar87);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._6_2_ >> 8 & 1) != 0) {
              pbVar70[lVar68 * 0xf] = false;
            }
            auVar74 = (auVar111 | auVar49) ^ auVar54;
            auVar104._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar104._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar104._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar104._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar41._4_4_ = auVar104._0_4_;
            auVar41._0_4_ = auVar104._0_4_;
            auVar41._8_4_ = auVar104._8_4_;
            auVar41._12_4_ = auVar104._8_4_;
            auVar116 = pshuflw(auVar151,auVar41,0xe8);
            auVar88._0_4_ = -(uint)(auVar74._0_4_ == iVar113);
            auVar88._4_4_ = -(uint)(auVar74._4_4_ == iVar118);
            auVar88._8_4_ = -(uint)(auVar74._8_4_ == iVar119);
            auVar88._12_4_ = -(uint)(auVar74._12_4_ == iVar120);
            auVar140._4_4_ = auVar88._4_4_;
            auVar140._0_4_ = auVar88._4_4_;
            auVar140._8_4_ = auVar88._12_4_;
            auVar140._12_4_ = auVar88._12_4_;
            auVar74 = pshuflw(auVar88,auVar140,0xe8);
            auVar141._4_4_ = auVar104._4_4_;
            auVar141._0_4_ = auVar104._4_4_;
            auVar141._8_4_ = auVar104._12_4_;
            auVar141._12_4_ = auVar104._12_4_;
            auVar75 = pshuflw(auVar104,auVar141,0xe8);
            auVar105._8_4_ = 0xffffffff;
            auVar105._0_8_ = 0xffffffffffffffff;
            auVar105._12_4_ = 0xffffffff;
            auVar105 = (auVar75 | auVar74 & auVar116) ^ auVar105;
            auVar75 = packssdw(auVar105,auVar105);
            auVar74 = packsswb(auVar74 & auVar116,auVar75);
            if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pbVar70[lVar68 * 0x11] = false;
            }
            auVar42._4_4_ = auVar104._0_4_;
            auVar42._0_4_ = auVar104._0_4_;
            auVar42._8_4_ = auVar104._8_4_;
            auVar42._12_4_ = auVar104._8_4_;
            auVar141 = auVar140 & auVar42 | auVar141;
            auVar75 = packssdw(auVar141,auVar141);
            auVar15._8_4_ = 0xffffffff;
            auVar15._0_8_ = 0xffffffffffffffff;
            auVar15._12_4_ = 0xffffffff;
            auVar75 = packssdw(auVar75 ^ auVar15,auVar75 ^ auVar15);
            auVar74 = packsswb(auVar74,auVar75);
            if ((auVar74._8_2_ >> 8 & 1) != 0) {
              pbVar70[lVar68 * 0x13] = false;
            }
            auVar74 = (auVar111 | auVar48) ^ auVar54;
            auVar106._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar106._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar106._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar106._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar142._4_4_ = auVar106._0_4_;
            auVar142._0_4_ = auVar106._0_4_;
            auVar142._8_4_ = auVar106._8_4_;
            auVar142._12_4_ = auVar106._8_4_;
            iVar146 = -(uint)(auVar74._4_4_ == iVar118);
            iVar153 = -(uint)(auVar74._12_4_ == iVar120);
            auVar43._4_4_ = iVar146;
            auVar43._0_4_ = iVar146;
            auVar43._8_4_ = iVar153;
            auVar43._12_4_ = iVar153;
            auVar152._4_4_ = auVar106._4_4_;
            auVar152._0_4_ = auVar106._4_4_;
            auVar152._8_4_ = auVar106._12_4_;
            auVar152._12_4_ = auVar106._12_4_;
            auVar74 = auVar43 & auVar142 | auVar152;
            auVar74 = packssdw(auVar74,auVar74);
            auVar16._8_4_ = 0xffffffff;
            auVar16._0_8_ = 0xffffffffffffffff;
            auVar16._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar16,auVar74 ^ auVar16);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              pbVar70[lVar68 * 0x15] = false;
            }
            auVar74 = pshufhw(auVar74,auVar142,0x84);
            auVar44._4_4_ = iVar146;
            auVar44._0_4_ = iVar146;
            auVar44._8_4_ = iVar153;
            auVar44._12_4_ = iVar153;
            auVar116 = pshufhw(auVar106,auVar44,0x84);
            auVar75 = pshufhw(auVar74,auVar152,0x84);
            auVar89._8_4_ = 0xffffffff;
            auVar89._0_8_ = 0xffffffffffffffff;
            auVar89._12_4_ = 0xffffffff;
            auVar89 = (auVar75 | auVar116 & auVar74) ^ auVar89;
            auVar74 = packssdw(auVar89,auVar89);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._10_2_ >> 8 & 1) != 0) {
              pbVar70[lVar68 * 0x17] = false;
            }
            auVar74 = (auVar111 | _DAT_00152ae0) ^ auVar54;
            auVar107._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar107._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar107._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar107._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar45._4_4_ = auVar107._0_4_;
            auVar45._0_4_ = auVar107._0_4_;
            auVar45._8_4_ = auVar107._8_4_;
            auVar45._12_4_ = auVar107._8_4_;
            auVar116 = pshuflw(auVar152,auVar45,0xe8);
            auVar90._0_4_ = -(uint)(auVar74._0_4_ == iVar113);
            auVar90._4_4_ = -(uint)(auVar74._4_4_ == iVar118);
            auVar90._8_4_ = -(uint)(auVar74._8_4_ == iVar119);
            auVar90._12_4_ = -(uint)(auVar74._12_4_ == iVar120);
            auVar143._4_4_ = auVar90._4_4_;
            auVar143._0_4_ = auVar90._4_4_;
            auVar143._8_4_ = auVar90._12_4_;
            auVar143._12_4_ = auVar90._12_4_;
            auVar74 = pshuflw(auVar90,auVar143,0xe8);
            auVar144._4_4_ = auVar107._4_4_;
            auVar144._0_4_ = auVar107._4_4_;
            auVar144._8_4_ = auVar107._12_4_;
            auVar144._12_4_ = auVar107._12_4_;
            auVar75 = pshuflw(auVar107,auVar144,0xe8);
            auVar17._8_4_ = 0xffffffff;
            auVar17._0_8_ = 0xffffffffffffffff;
            auVar17._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 & auVar116,(auVar75 | auVar74 & auVar116) ^ auVar17);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pbVar70[lVar68 * 0x19] = false;
            }
            auVar46._4_4_ = auVar107._0_4_;
            auVar46._0_4_ = auVar107._0_4_;
            auVar46._8_4_ = auVar107._8_4_;
            auVar46._12_4_ = auVar107._8_4_;
            auVar144 = auVar143 & auVar46 | auVar144;
            auVar75 = packssdw(auVar144,auVar144);
            auVar18._8_4_ = 0xffffffff;
            auVar18._0_8_ = 0xffffffffffffffff;
            auVar18._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74,auVar75 ^ auVar18);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._12_2_ >> 8 & 1) != 0) {
              pbVar70[lVar68 * 0x1b] = false;
            }
            auVar74 = (auVar111 | _DAT_00152ad0) ^ auVar54;
            auVar91._0_4_ = -(uint)(iVar113 < auVar74._0_4_);
            auVar91._4_4_ = -(uint)(iVar118 < auVar74._4_4_);
            auVar91._8_4_ = -(uint)(iVar119 < auVar74._8_4_);
            auVar91._12_4_ = -(uint)(iVar120 < auVar74._12_4_);
            auVar145._4_4_ = auVar91._0_4_;
            auVar145._0_4_ = auVar91._0_4_;
            auVar145._8_4_ = auVar91._8_4_;
            auVar145._12_4_ = auVar91._8_4_;
            auVar112._4_4_ = -(uint)(auVar74._4_4_ == iVar118);
            auVar112._12_4_ = -(uint)(auVar74._12_4_ == iVar120);
            auVar112._0_4_ = auVar112._4_4_;
            auVar112._8_4_ = auVar112._12_4_;
            auVar117._4_4_ = auVar91._4_4_;
            auVar117._0_4_ = auVar91._4_4_;
            auVar117._8_4_ = auVar91._12_4_;
            auVar117._12_4_ = auVar91._12_4_;
            auVar75 = auVar112 & auVar145 | auVar117;
            auVar74 = packssdw(auVar91,auVar75);
            auVar19._8_4_ = 0xffffffff;
            auVar19._0_8_ = 0xffffffffffffffff;
            auVar19._12_4_ = 0xffffffff;
            auVar74 = packssdw(auVar74 ^ auVar19,auVar74 ^ auVar19);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pbVar70[lVar68 * 0x1d] = false;
            }
            auVar74 = pshufhw(auVar74,auVar145,0x84);
            auVar75 = pshufhw(auVar75,auVar112,0x84);
            auVar75 = auVar75 & auVar74;
            auVar74 = pshufhw(auVar74,auVar117,0x84);
            auVar92._8_4_ = 0xffffffff;
            auVar92._0_8_ = 0xffffffffffffffff;
            auVar92._12_4_ = 0xffffffff;
            auVar92 = (auVar74 | auVar75) ^ auVar92;
            auVar74 = packssdw(auVar92,auVar92);
            auVar74 = packsswb(auVar74,auVar74);
            if ((auVar74._14_2_ >> 8 & 1) != 0) {
              pbVar70[lVar68 * 0x1f] = false;
            }
            uVar66 = uVar66 + 0x10;
            pbVar70 = pbVar70 + lVar68 * 0x20;
          } while ((uVar63 + uVar64 + 0x10 & 0xfffffffffffffff0) != uVar66);
        }
        uVar57 = uVar57 + 1;
        local_90 = lVar65;
      } while (uVar57 != a);
    }
    else {
      lVar65 = 0;
    }
    local_b8 = iVar58;
    local_a8 = x;
    local_98 = max;
    operator_delete(pbVar55,(long)local_48.capacity_ - (long)pbVar55);
    iVar58 = local_b8 + lVar65 + a + ~local_b0;
    operator_delete(local_78.array_,(long)local_78.capacity_ - (long)local_78.array_);
    operator_delete(local_60.array_,(long)local_60.capacity_ - (long)local_60.array_);
    operator_delete(local_d0.array_,(long)local_d0.capacity_ - (long)local_d0.array_);
  }
  return iVar58;
}

Assistant:

int64_t pi_lmo2(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}